

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Alarm.cpp
# Opt level: O3

void __thiscall Alarm::Alarm(Alarm *this,uint64_t millis,function<void_()> *callback)

{
  undefined8 uVar1;
  long lVar2;
  Error *this_00;
  
  *(undefined8 *)&(this->callback).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->callback).super__Function_base._M_functor + 8) = 0;
  (this->callback).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->callback)._M_invoker = callback->_M_invoker;
  if ((callback->super__Function_base)._M_manager != (_Manager_type)0x0) {
    uVar1 = *(undefined8 *)((long)&(callback->super__Function_base)._M_functor + 8);
    *(undefined8 *)&(this->callback).super__Function_base._M_functor =
         *(undefined8 *)&(callback->super__Function_base)._M_functor;
    *(undefined8 *)((long)&(this->callback).super__Function_base._M_functor + 8) = uVar1;
    (this->callback).super__Function_base._M_manager = (callback->super__Function_base)._M_manager;
    (callback->super__Function_base)._M_manager = (_Manager_type)0x0;
    callback->_M_invoker = (_Invoker_type)0x0;
  }
  if (millis != 0) {
    lVar2 = std::chrono::_V2::system_clock::now();
    this->millis = lVar2 / 1000000 + millis;
    return;
  }
  this_00 = (Error *)__cxa_allocate_exception(0x3f0);
  Error::Error(this_00,"Illegal millis value");
  __cxa_throw(this_00,&Error::typeinfo,std::exception::~exception);
}

Assistant:

Alarm::Alarm(uint64_t millis, std::function<void()> callback) : callback(std::move(callback)) {
  if (millis <= 0) {
    throw Error("Illegal millis value");
  }
  uint64_t now = current_time_millis();
  this->millis = now + millis;
}